

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<VkSurfaceFormatKHR> *
vkb::detail::find_desired_surface_format
          (Result<VkSurfaceFormatKHR> *__return_storage_ptr__,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *available_formats,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *desired_formats)

{
  bool bVar1;
  pointer pVVar2;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range2;
  pointer pVVar3;
  
  pVVar2 = (desired_formats->
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pVVar3 = (available_formats->
             super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pVVar2 == (desired_formats->
                  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->field_0).m_value.format = VK_FORMAT_R5G6B5_UNORM_PACK16;
      *(undefined ***)((long)&__return_storage_ptr__->field_0 + 8) = &surface_support_error_category
      ;
      (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
      bVar1 = false;
LAB_0012e336:
      __return_storage_ptr__->m_init = bVar1;
      return __return_storage_ptr__;
    }
    for (; pVVar3 != (available_formats->
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>).
                     _M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
      if ((pVVar2->format == pVVar3->format) && (pVVar2->colorSpace == pVVar3->colorSpace)) {
        (__return_storage_ptr__->field_0).m_value = *pVVar2;
        bVar1 = true;
        goto LAB_0012e336;
      }
    }
    pVVar2 = pVVar2 + 1;
  } while( true );
}

Assistant:

Result<VkSurfaceFormatKHR> find_desired_surface_format(
    std::vector<VkSurfaceFormatKHR> const& available_formats, std::vector<VkSurfaceFormatKHR> const& desired_formats) {
    for (auto const& desired_format : desired_formats) {
        for (auto const& available_format : available_formats) {
            // finds the first format that is desired and available
            if (desired_format.format == available_format.format && desired_format.colorSpace == available_format.colorSpace) {
                return desired_format;
            }
        }
    }

    // if no desired format is available, we report that no format is suitable to the user request
    return { make_error_code(SurfaceSupportError::no_suitable_desired_format) };
}